

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_crazyunits_Test::TestBody(unitStrings_crazyunits_Test *this)

{
  precise_unit *ppVar1;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *pcVar2;
  string str;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelper local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  string local_30;
  
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f0a31;
  __return_storage_ptr__ = &local_30;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)local_50,ppVar1,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[25]>
            ((internal *)local_50,"str","\"m*kg^2*s^3*A*K^-1*mol^-1\"",__return_storage_ptr__,
             (char (*) [25])"m*kg^2*s^3*A*K^-1*mol^-1");
  if (local_50[0] == (units)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (string *)0x16c;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000701d1;
  units::to_string_abi_cxx11_
            ((string *)local_50,(units *)&local_70,ppVar1,(uint64_t)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&local_30,(string *)local_50);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  lhs = &local_30;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_50,"str","\"W*m^-1*K^-1\"",lhs,(char (*) [12])"W*m^-1*K^-1");
  if (local_50[0] == (units)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x170;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60.data_ = (AssertHelperData *)0x4024000000000000;
  local_58 = 0x10000000;
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_50,(units *)&local_60,ppVar1,(uint64_t)lhs);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_70,"to_string(precise_unit(10, precise::pu))","\"10*pu\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [6])"10*pu");
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  if (local_70._M_head_impl._0_1_ == (units)0x0) {
    testing::Message::Message((Message *)local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_50 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_50 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(unitStrings, crazyunits)
{
    unit cz{detail::unit_data(1, 2, 3, 1, -1, -1, 0, 0, 0, 0, 0, 0, 0, 0)};
    auto str = to_string(cz);
    EXPECT_EQ(str, "m*kg^2*s^3*A*K^-1*mol^-1");
    // thermal conductivity W/(m*K)
    unit tc{detail::unit_data(1, 1, -3, 0, -1, 0, 0, 0, 0, 0, 0, 0, 0, 0)};
    str = to_string(tc);
    EXPECT_EQ(str, "W*m^-1*K^-1");
    EXPECT_EQ(to_string(precise_unit(10, precise::pu)), "10*pu");
}